

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O1

Expression * __thiscall
slang::ast::builtins::DumpPortsTask::bindArgument
          (DumpPortsTask *this,size_t argIndex,ASTContext *context,ExpressionSyntax *syntax,
          Args *args)

{
  Scope *pSVar1;
  Compilation *this_00;
  bool bVar2;
  Compilation *compilation;
  Expression *pEVar3;
  bitmask<slang::ast::LookupFlags> extraLookupFlags;
  Args *pAVar4;
  
  pAVar4 = args;
  bVar2 = slang::syntax::NameSyntax::isKind((syntax->super_SyntaxNode).kind);
  extraLookupFlags.m_bits = (underlying_type)pAVar4;
  if (!bVar2) {
    pEVar3 = SystemSubroutine::bindArgument((SystemSubroutine *)this,argIndex,context,syntax,args);
    return pEVar3;
  }
  pSVar1 = (context->scope).ptr;
  if (pSVar1 != (Scope *)0x0) {
    this_00 = pSVar1->compilation;
    compilation = (Compilation *)
                  slang::syntax::SyntaxNode::as<slang::syntax::NameSyntax>
                            (&syntax->super_SyntaxNode);
    pEVar3 = HierarchicalReferenceExpression::fromSyntax
                       ((HierarchicalReferenceExpression *)this_00,compilation,(NameSyntax *)context
                        ,(ASTContext *)0x0,extraLookupFlags);
    return pEVar3;
  }
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,
             "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]"
            );
}

Assistant:

const Expression& bindArgument(size_t argIndex, const ASTContext& context,
                                   const ExpressionSyntax& syntax, const Args& args) const final {
        if (NameSyntax::isKind(syntax.kind)) {
            return HierarchicalReferenceExpression::fromSyntax(context.getCompilation(),
                                                               syntax.as<NameSyntax>(), context);
        }

        return SystemTaskBase::bindArgument(argIndex, context, syntax, args);
    }